

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,NamedPoint *val)

{
  double dVar1;
  ulong extraout_RAX;
  vector<double,_std::allocator<double>_> *val_00;
  size_type __len1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_01;
  complex<double> val_02;
  vector<double,_std::allocator<double>_> vec;
  double val_1;
  _Uninitialized<double,_true> local_68;
  vector<double,_std::allocator<double>_> local_60;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_48;
  double *local_18;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,&local_48._M_first._M_storage);
    local_68._M_storage = (double)local_48._M_first._M_storage;
    break;
  case HELICS_INT:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)&local_48._M_first);
    local_68._M_storage = (double)(long)local_48._M_first._M_storage;
    break;
  case HELICS_COMPLEX:
    local_48._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
    local_48._8_8_ = 0.0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)&local_48._M_first);
    if (((double)local_48._8_8_ != 0.0) || (NAN((double)local_48._8_8_))) {
      valueExtract();
      return;
    }
    __len1 = (val->name)._M_string_length;
    local_68._M_storage = (double)local_48._M_first._M_storage;
    goto LAB_0025f4d2;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret(&local_60,data);
    if ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&val->name,0,(val->name)._M_string_length,"value",5);
      val->value = *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else {
      helicsVectorString_abi_cxx11_((string *)&local_48._M_first,(helics *)&local_60,val_00);
      valueExtract();
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_18;
      if ((extraout_RAX & 1) != 0) {
        return;
      }
    }
    goto LAB_0025f3c4;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_60,data
             );
    if ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      val_02._M_value._8_8_ = 0x10;
      val_02._M_value._0_8_ = val_01;
      helicsComplexString_abi_cxx11_((string *)&local_48._M_first,(helics *)data,val_02);
      valueExtract();
    }
    else {
      helicsComplexVectorString_abi_cxx11_((string *)&local_48._M_first,(helics *)&local_60,val_01);
      valueExtract();
    }
    dVar1 = nan("0");
    val->value = dVar1;
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (double *)0x0) {
      return;
    }
LAB_0025f3c4:
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return;
  case HELICS_NAMED_POINT:
    valueExtract();
    return;
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)&local_48._M_first);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&val->name,0,(val->name)._M_string_length,"time",4);
    val->value = (double)((long)local_48._M_first._M_storage % 1000000000) * 1e-09 +
                 (double)((long)local_48._M_first._M_storage / 1000000000);
    return;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&local_48._M_first,(helics *)data,(data_view *)val);
      valueExtract((defV *)&local_48._M_first,val);
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_48._M_first);
      return;
    }
  case HELICS_BOOL:
    valueExtract();
    return;
  }
  __len1 = (val->name)._M_string_length;
LAB_0025f4d2:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&val->name,0,__len1,"value",5);
  val->value = local_68._M_storage;
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, NamedPoint& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val.name = "value";
            val.value = value;
            break;
        }
        case DataType::HELICS_INT: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val.name = "value";
            val.value = static_cast<double>(value);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.name = "time";
            val.value = static_cast<double>(time);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetNamedPoint(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val.name = "value";

                val.value = vec[0];
            } else {
                val.name = helicsVectorString(vec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            if (cval.imag() == 0) {
                val.name = "value";
                val.value = cval.real();
            } else {
                val.name = helicsComplexString(cval);
                val.value = std::nan("0");
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (cvec.size() == 1) {
                val.name = helicsComplexString(cvec[0]);
                val.value = std::nan("0");
            } else {
                val.name = helicsComplexVectorString(cvec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_NAMED_POINT:
            val = ValueConverter<NamedPoint>::interpret(data);
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}